

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O2

int __thiscall adios2::fstream::open(fstream *this,char *__file,int __oflag,...)

{
  int iVar1;
  char (*in_R8) [4];
  undefined1 local_50 [12];
  undefined4 local_44;
  __shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  adios2::fstream::CheckOpen((string *)this);
  local_44 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI((ompi_communicator_t *)local_50);
  std::
  make_shared<adios2::core::Stream,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,char_const(&)[4]>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
             (Mode *)__file,(Comm *)&local_44,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,in_R8);
  std::__shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  iVar1 = adios2::helper::Comm::~Comm((Comm *)local_50);
  return iVar1;
}

Assistant:

void fstream::open(const std::string &name, const openmode mode, MPI_Comm comm,
                   const std::string engineType)
{
    CheckOpen(name);
    m_Stream = std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm),
                                              engineType, "C++");
}